

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_and(runtime_type *this,iterator *a,iterator *b)

{
  bool *pbVar1;
  bool *in_RSI;
  proxy *in_RDI;
  bool bVar2;
  any *unaff_retaddr;
  undefined1 in_stack_000008bf;
  iterator *in_stack_000008c0;
  runtime_type *in_stack_000008c8;
  
  parse_expr(in_stack_000008c8,in_stack_000008c0,(bool)in_stack_000008bf);
  pbVar1 = cs_impl::any::const_val<bool>(unaff_retaddr);
  bVar2 = (*pbVar1 & 1U) != 0;
  if (bVar2) {
    parse_expr(in_stack_000008c8,in_stack_000008c0,(bool)in_stack_000008bf);
    cs_impl::any::const_val<bool>(unaff_retaddr);
  }
  cs_impl::any::make<bool,bool>(in_RSI);
  if (bVar2) {
    cs_impl::any::~any((any *)0x51ce06);
  }
  cs_impl::any::~any((any *)0x51ce10);
  return (var)in_RDI;
}

Assistant:

var
	runtime_type::parse_and(const tree_type<token_base *>::iterator &a, const tree_type<token_base *>::iterator &b)
	{
		return var::make<boolean>(parse_expr(a).const_val<boolean>() && parse_expr(b).const_val<boolean>());
	}